

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zes_parameter_validation.cpp
# Opt level: O1

ze_result_t __thiscall
validation_layer::ZESParameterValidation::zesDriverGetDeviceByUuidExpPrologue
          (ZESParameterValidation *this,zes_driver_handle_t hDriver,zes_uuid_t uuid,
          zes_device_handle_t *phDevice,ze_bool_t *onSubdevice,uint32_t *subdeviceId)

{
  ze_result_t zVar1;
  
  if (hDriver != (zes_driver_handle_t)0x0) {
    zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER;
    if ((onSubdevice != (ze_bool_t *)0x0 && phDevice != (zes_device_handle_t *)0x0) &&
       (zVar1 = ZE_RESULT_ERROR_INVALID_NULL_POINTER, subdeviceId != (uint32_t *)0x0)) {
      zVar1 = ZE_RESULT_SUCCESS;
    }
    return zVar1;
  }
  return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;
}

Assistant:

ze_result_t
    ZESParameterValidation::zesDriverGetDeviceByUuidExpPrologue(
        zes_driver_handle_t hDriver,                    ///< [in] handle of the sysman driver instance
        zes_uuid_t uuid,                                ///< [in] universal unique identifier.
        zes_device_handle_t* phDevice,                  ///< [out] Sysman handle of the device.
        ze_bool_t* onSubdevice,                         ///< [out] True if the UUID belongs to the sub-device; false means that
                                                        ///< UUID belongs to the root device.
        uint32_t* subdeviceId                           ///< [out] If onSubdevice is true, this gives the ID of the sub-device
        )
    {
        if( nullptr == hDriver )
            return ZE_RESULT_ERROR_INVALID_NULL_HANDLE;

        if( nullptr == phDevice )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == onSubdevice )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        if( nullptr == subdeviceId )
            return ZE_RESULT_ERROR_INVALID_NULL_POINTER;

        return ZE_RESULT_SUCCESS;
    }